

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar_analyze.cpp
# Opt level: O0

void grammar_analyze(string *src,vector<Token,_std::allocator<Token>_> *res)

{
  ulong uVar1;
  char *pcVar2;
  int local_20;
  Dfstate local_1c;
  int i;
  Dfstate newState;
  vector<Token,_std::allocator<Token>_> *res_local;
  string *src_local;
  
  local_1c = INITIAL;
  local_20 = 0;
  _i = res;
  res_local = (vector<Token,_std::allocator<Token>_> *)src;
  while( true ) {
    uVar1 = std::__cxx11::string::length();
    if (uVar1 <= (ulong)(long)local_20) break;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)res_local);
    handleState(*pcVar2,&local_1c,_i);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void grammar_analyze(const std::string& src, std::vector<Token>& res) {
    Dfstate newState = Dfstate::INITIAL;
    for (int i = 0; i < src.length(); i++) {
        handleState(src[i], newState, res);
    }
}